

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall ON_BinaryArchive::ArchiveCurrentDimStyleIndex(ON_BinaryArchive *this)

{
  bool bVar1;
  ON_DimStyle *pOVar2;
  ON_UUID *pOVar3;
  ON_ComponentManifestItem *this_00;
  ON_ComponentManifestItem *item;
  ON_DimStyle *dim_style;
  ON_BinaryArchive *this_local;
  
  pOVar2 = ArchiveCurrentDimStyle(this);
  bVar1 = ON_ModelComponent::IsSystemComponent(&pOVar2->super_ON_ModelComponent);
  if (bVar1) {
    this_local._4_4_ = ON_ModelComponent::Index(&pOVar2->super_ON_ModelComponent);
  }
  else {
    pOVar2 = ArchiveCurrentDimStyle(this);
    pOVar3 = ON_ModelComponent::Id(&pOVar2->super_ON_ModelComponent);
    this_00 = ON_ComponentManifest::ItemFromId(&this->m_manifest,DimStyle,*pOVar3);
    bVar1 = ON_ComponentManifestItem::IsValid(this_00);
    if (bVar1) {
      this_local._4_4_ = ON_ComponentManifestItem::Index(this_00);
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

const int ON_BinaryArchive::ArchiveCurrentDimStyleIndex() const
{
  const ON_DimStyle& dim_style = ArchiveCurrentDimStyle();
  if (dim_style.IsSystemComponent())
    return dim_style.Index();

  const ON_ComponentManifestItem& item = m_manifest.ItemFromId(ON_ModelComponent::Type::DimStyle,ArchiveCurrentDimStyle().Id());
  if (item.IsValid())
    return item.Index();

  return -1;
}